

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  undefined4 extraout_var;
  ulong uVar6;
  FieldDescriptor *field;
  ulong uVar7;
  byte *pbVar8;
  byte unaff_BPL;
  uint uVar9;
  string message_data;
  CodedOutputStream coded_output;
  string temp;
  StringOutputStream output_stream;
  string local_d8;
  CodedOutputStream local_b8;
  undefined1 local_98 [32];
  undefined6 uStack_78;
  undefined8 local_70;
  int local_68;
  int local_64;
  int local_60;
  bool local_5c;
  DescriptorPool *local_58;
  MessageFactory *pMStack_50;
  long *local_48;
  StringOutputStream local_40;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  local_48 = (long *)CONCAT44(extraout_var,iVar4);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  uVar7 = 0;
  field = (FieldDescriptor *)0x0;
  do {
    pbVar8 = input->buffer_;
    uVar5 = 0;
    if (pbVar8 < input->buffer_end_) {
      bVar1 = *pbVar8;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\0') goto LAB_0033e1b2;
      input->last_tag_ = (uint)bVar1;
      input->buffer_ = pbVar8 + 1;
    }
    else {
LAB_0033e1b2:
      uVar5 = io::CodedInputStream::ReadTagFallback(input,uVar5);
      input->last_tag_ = uVar5;
    }
    if ((int)uVar5 < 0x10) {
      if (uVar5 == 0) {
LAB_0033e209:
        unaff_BPL = 0;
      }
      else {
        if (uVar5 != 0xc) {
LAB_0033e1f5:
          bVar3 = SkipField(input,uVar5,(UnknownFieldSet *)0x0);
LAB_0033e201:
          if (bVar3 == false) goto LAB_0033e209;
LAB_0033e493:
          bVar3 = true;
          goto LAB_0033e495;
        }
        unaff_BPL = 1;
      }
      bVar3 = false;
    }
    else if (uVar5 == 0x10) {
      pbVar8 = input->buffer_;
      if (pbVar8 < input->buffer_end_) {
        bVar1 = *pbVar8;
        uVar6 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0033e270;
        input->buffer_ = pbVar8 + 1;
        bVar3 = true;
      }
      else {
        uVar5 = 0;
LAB_0033e270:
        uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar3 = -1 < (long)uVar6;
      }
      if (bVar3) {
        field = (FieldDescriptor *)(**(code **)(*local_48 + 0x270))(local_48,uVar6 & 0xffffffff);
        uVar7 = uVar6;
        if (local_d8._M_string_length == 0) {
          bVar3 = true;
        }
        else {
          io::ArrayInputStream::ArrayInputStream
                    ((ArrayInputStream *)&local_b8,local_d8._M_dataplus._M_p,
                     (int)local_d8._M_string_length,-1);
          local_98._0_8_ = (uint8 *)0x0;
          local_98._8_8_ = (uint8 *)0x0;
          uStack_78._0_4_ = 0;
          uStack_78._4_1_ = false;
          uStack_78._5_1_ = false;
          local_98._24_6_ = 0;
          local_98._30_2_ = 0;
          local_70._0_4_ = 0x7fffffff;
          local_70._4_4_ = 0;
          local_68 = 0x7fffffff;
          local_64 = io::CodedInputStream::default_recursion_limit_;
          local_60 = io::CodedInputStream::default_recursion_limit_;
          local_5c = true;
          local_58 = (DescriptorPool *)0x0;
          pMStack_50 = (MessageFactory *)0x0;
          local_98._16_8_ = &local_b8;
          io::CodedInputStream::Refresh((CodedInputStream *)local_98);
          bVar3 = ParseAndMergeMessageSetField
                            ((uint32)uVar6,field,message,(CodedInputStream *)local_98);
          if (bVar3) {
            local_d8._M_string_length = 0;
            *local_d8._M_dataplus._M_p = '\0';
          }
          else {
            unaff_BPL = 0;
          }
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_98);
          io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&local_b8);
        }
      }
      else {
        unaff_BPL = 0;
        bVar3 = false;
      }
      if (bVar3 != false) {
        uVar7 = uVar7 & 0xffffffff;
        goto LAB_0033e493;
      }
      bVar3 = false;
      uVar7 = uVar7 & 0xffffffff;
    }
    else {
      if (uVar5 != 0x1a) goto LAB_0033e1f5;
      if ((uint32)uVar7 != 0) {
        bVar3 = ParseAndMergeMessageSetField((uint32)uVar7,field,message,input);
        goto LAB_0033e201;
      }
      local_98._0_8_ = local_98 + 0x10;
      local_98._8_8_ = (uint8 *)0x0;
      local_98._16_8_ = local_98._16_8_ & 0xffffffffffffff00;
      pbVar8 = input->buffer_;
      if (pbVar8 < input->buffer_end_) {
        bVar1 = *pbVar8;
        uVar7 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0033e384;
        input->buffer_ = pbVar8 + 1;
        bVar3 = true;
      }
      else {
        uVar5 = 0;
LAB_0033e384:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar3 = -1 < (long)uVar7;
      }
      uVar9 = (uint)uVar7;
      if ((bVar3) &&
         (bVar3 = io::CodedInputStream::ReadString(input,(string *)local_98,uVar9), bVar3)) {
        io::StringOutputStream::StringOutputStream(&local_40,&local_d8);
        io::CodedOutputStream::CodedOutputStream(&local_b8,&local_40.super_ZeroCopyOutputStream);
        if (local_b8.buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(&local_b8,uVar9);
        }
        else {
          pbVar8 = local_b8.buffer_;
          if (uVar9 < 0x80) {
            uVar6 = uVar7 & 0xffffffff;
          }
          else {
            uVar6 = uVar7 & 0xffffffff;
            do {
              uVar9 = (uint)uVar7;
              *pbVar8 = (byte)uVar7 | 0x80;
              uVar6 = uVar6 >> 7;
              pbVar8 = pbVar8 + 1;
              uVar7 = uVar6;
            } while (0x3fff < uVar9);
          }
          *pbVar8 = (byte)uVar6;
          iVar4 = ((int)pbVar8 - (int)local_b8.buffer_) + 1;
          local_b8.buffer_ = local_b8.buffer_ + iVar4;
          local_b8.buffer_size_ = local_b8.buffer_size_ - iVar4;
        }
        io::CodedOutputStream::WriteRaw(&local_b8,(void *)local_98._0_8_,local_98._8_4_);
        io::CodedOutputStream::~CodedOutputStream(&local_b8);
        io::StringOutputStream::~StringOutputStream(&local_40);
        bVar2 = true;
      }
      else {
        unaff_BPL = 0;
        bVar2 = false;
      }
      if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
      }
      uVar7 = 0;
      bVar3 = false;
      if (bVar2) goto LAB_0033e493;
    }
LAB_0033e495:
    if (!bVar3) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(
    io::CodedInputStream* input,
    Message* message) {
  const Reflection* message_reflection = message->GetReflection();

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // Once we see a type_id, we'll look up the FieldDescriptor for the
  // extension.
  const FieldDescriptor* field = NULL;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;
        field = message_reflection->FindKnownExtensionByNumber(type_id);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::ArrayInputStream raw_input(message_data.data(),
                                         message_data.size());
          io::CodedInputStream sub_input(&raw_input);
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            &sub_input)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseAndMergeMessageSetField(last_type_id, field, message,
                                            input)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!SkipField(input, tag, NULL)) return false;
      }
    }
  }
}